

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O3

GLvoid __thiscall
gl4cts::anon_unknown_0::GatherBase::CreateTexture2DArray(GatherBase *this,int slices,int data_slice)

{
  CallLogWrapper *this_00;
  int iVar1;
  GLenum format;
  int i;
  int level;
  ulong uVar2;
  allocator_type local_95;
  int local_94;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixels;
  value_type local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_94 = data_slice;
  iVar1 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])();
  format = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x22])(this);
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,this->tex);
  uVar2 = 0x20;
  level = 0;
  do {
    glu::CallLogWrapper::glTexImage3D
              (this_00,0x8c1a,level,iVar1,(GLsizei)uVar2,(GLsizei)uVar2,slices,0,format,0x1406,
               (void *)0x0);
    level = level + 1;
    uVar2 = uVar2 >> 1;
  } while (level != 6);
  local_78.m_data[0] = 1.0;
  local_78.m_data[1] = 1.0;
  local_78.m_data[2] = 1.0;
  local_78.m_data[3] = 1.0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&pixels,0x400,&local_78,&local_95);
  if (0 < slices) {
    iVar1 = 0;
    do {
      glu::CallLogWrapper::glTexSubImage3D
                (this_00,0x8c1a,0,0,0,iVar1,0x20,0x20,1,format,0x1406,
                 pixels.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      iVar1 = iVar1 + 1;
    } while (slices != iVar1);
  }
  if (format != 0x1902) {
    glu::CallLogWrapper::glGenerateMipmap(this_00,0x8c1a);
  }
  iVar1 = local_94;
  local_78.m_data[0] = 0.75;
  local_78.m_data[1] = 0.8125;
  local_78.m_data[2] = 0.875;
  local_78.m_data[3] = 0.9375;
  local_68 = 0x3f1000003f000000;
  uStack_60 = 0x3f3000003f200000;
  local_58 = 0x3d80000000000000;
  uStack_50 = 0x3e4000003e000000;
  local_48 = 0x3ea000003e800000;
  uStack_40 = 0x3ee000003ec00000;
  glu::CallLogWrapper::glTexSubImage3D
            (this_00,0x8c1a,0,0x16,0x19,local_94,2,2,1,format,0x1406,&local_78);
  glu::CallLogWrapper::glTexSubImage3D(this_00,0x8c1a,0,0x10,10,iVar1,1,1,1,format,0x1406,&local_78)
  ;
  glu::CallLogWrapper::glTexSubImage3D(this_00,0x8c1a,0,0xb,2,iVar1,1,1,1,format,0x1406,&local_68);
  glu::CallLogWrapper::glTexSubImage3D
            (this_00,0x8c1a,0,0x18,0xd,iVar1,1,1,1,format,0x1406,&local_58);
  glu::CallLogWrapper::glTexSubImage3D(this_00,0x8c1a,0,9,0xe,iVar1,1,1,1,format,0x1406,&local_48);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x8072,0x812f);
  if (pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pixels.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pixels.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pixels.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual GLvoid CreateTexture2DArray(int slices, int data_slice)
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= Format();
		const GLint csize			= 32;
		GLint		size			= csize;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D_ARRAY, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			glTexImage3D(GL_TEXTURE_2D_ARRAY, i, internal_format, size, size, slices, 0, format, GL_FLOAT, 0);
		}
		std::vector<Vec4> pixels(csize * csize, Vec4(1.0));
		for (int i = 0; i < slices; ++i)
		{
			glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 0, i, csize, csize, 1, format, GL_FLOAT, &pixels[0]);
		}

		if (format != GL_DEPTH_COMPONENT)
		{
			glGenerateMipmap(GL_TEXTURE_2D_ARRAY);
		}

		Vec4 data[4] = { Vec4(12. / 16, 13. / 16, 14. / 16, 15. / 16), Vec4(8. / 16, 9. / 16, 10. / 16, 11. / 16),
						 Vec4(0. / 16, 1. / 16, 2. / 16, 3. / 16), Vec4(4. / 16, 5. / 16, 6. / 16, 7. / 16) };

		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 22, 25, data_slice, 2, 2, 1, format, GL_FLOAT, data);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 16, 10, data_slice, 1, 1, 1, format, GL_FLOAT, data + 0);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 11, 2, data_slice, 1, 1, 1, format, GL_FLOAT, data + 1);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 24, 13, data_slice, 1, 1, 1, format, GL_FLOAT, data + 2);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 9, 14, data_slice, 1, 1, 1, format, GL_FLOAT, data + 3);

		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
	}